

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void Adam7_interlace(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  uchar bit_00;
  ulong uVar7;
  uint in_ECX;
  uint in_EDX;
  uchar *in_RSI;
  uchar *in_RDI;
  uint in_R8D;
  uchar bit;
  size_t ibp;
  size_t obp;
  uint olinebits;
  uint ilinebits;
  uint b_1;
  uint y_1;
  uint x_1;
  size_t pixeloutstart;
  size_t pixelinstart;
  size_t bytewidth;
  uint b;
  uint y;
  uint x;
  uint i;
  size_t passstart [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  uint passh [7];
  uint passw [7];
  ulong local_168;
  size_t local_160;
  int local_154;
  int local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  size_t local_118 [8];
  size_t local_d8 [8];
  size_t local_98 [8];
  uint local_58 [8];
  uint local_38 [7];
  uint local_1c;
  uint local_14;
  uchar *local_10;
  uchar *local_8;
  
  local_1c = in_R8D;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Adam7_getpassvalues(local_38,local_58,local_98,local_d8,local_118,in_EDX,in_ECX,in_R8D);
  if (local_1c < 8) {
    for (local_11c = 0; local_11c != 7; local_11c = local_11c + 1) {
      local_150 = local_1c * local_38[local_11c];
      local_154 = local_1c * local_14;
      for (local_148 = 0; local_148 < local_58[local_11c]; local_148 = local_148 + 1) {
        for (local_144 = 0; local_144 < local_38[local_11c]; local_144 = local_144 + 1) {
          local_168 = (ulong)((ADAM7_IY[local_11c] + local_148 * ADAM7_DY[local_11c]) * local_154 +
                             (ADAM7_IX[local_11c] + local_144 * ADAM7_DX[local_11c]) * local_1c);
          local_160 = local_118[local_11c] * 8 +
                      (ulong)(local_148 * local_150 + local_144 * local_1c);
          for (local_14c = 0; local_14c < local_1c; local_14c = local_14c + 1) {
            bit_00 = readBitFromReversedStream(&local_168,local_10);
            setBitOfReversedStream(&local_160,local_8,bit_00);
          }
        }
      }
    }
  }
  else {
    for (local_11c = 0; local_11c != 7; local_11c = local_11c + 1) {
      uVar7 = (ulong)(local_1c >> 3);
      for (local_124 = 0; local_124 < local_58[local_11c]; local_124 = local_124 + 1) {
        for (local_120 = 0; local_120 < local_38[local_11c]; local_120 = local_120 + 1) {
          uVar1 = ADAM7_IY[local_11c];
          uVar2 = ADAM7_DY[local_11c];
          uVar3 = ADAM7_IX[local_11c];
          uVar4 = ADAM7_DX[local_11c];
          sVar6 = local_118[local_11c];
          uVar5 = local_38[local_11c];
          for (local_128 = 0; local_128 < uVar7; local_128 = local_128 + 1) {
            local_8[sVar6 + (local_124 * uVar5 + local_120) * uVar7 + (ulong)local_128] =
                 local_10[((uVar1 + local_124 * uVar2) * local_14 + uVar3 + local_120 * uVar4) *
                          uVar7 + (ulong)local_128];
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void Adam7_interlace(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp)
{
	unsigned passw[7], passh[7];
	size_t filter_passstart[8], padded_passstart[8], passstart[8];
	unsigned i;

	Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

	if (bpp >= 8)
	{
		for (i = 0; i != 7; ++i)
		{
			unsigned x, y, b;
			size_t bytewidth = bpp / 8;
			for (y = 0; y < passh[i]; ++y)
				for (x = 0; x < passw[i]; ++x)
				{
					size_t pixelinstart = ((ADAM7_IY[i] + y * ADAM7_DY[i]) * w + ADAM7_IX[i] + x * ADAM7_DX[i]) * bytewidth;
					size_t pixeloutstart = passstart[i] + (y * passw[i] + x) * bytewidth;
					for (b = 0; b < bytewidth; ++b)
					{
						out[pixeloutstart + b] = in[pixelinstart + b];
					}
				}
		}
	}
	else /*bpp < 8: Adam7 with pixels < 8 bit is a bit trickier: with bit pointers*/
	{
		for (i = 0; i != 7; ++i)
		{
			unsigned x, y, b;
			unsigned ilinebits = bpp * passw[i];
			unsigned olinebits = bpp * w;
			size_t obp, ibp; /*bit pointers (for out and in buffer)*/
			for (y = 0; y < passh[i]; ++y)
				for (x = 0; x < passw[i]; ++x)
				{
					ibp = (ADAM7_IY[i] + y * ADAM7_DY[i]) * olinebits + (ADAM7_IX[i] + x * ADAM7_DX[i]) * bpp;
					obp = (8 * passstart[i]) + (y * ilinebits + x * bpp);
					for (b = 0; b < bpp; ++b)
					{
						unsigned char bit = readBitFromReversedStream(&ibp, in);
						setBitOfReversedStream(&obp, out, bit);
					}
				}
		}
	}
}